

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ListGraph.c
# Opt level: O2

int get_weight(LGraph G,int start,int end)

{
  ENode *pEVar1;
  int iVar2;
  
  iVar2 = 0;
  if (start != end) {
    pEVar1 = (ENode *)(G.vexs + start);
    while (pEVar1 = pEVar1->next_edge, pEVar1 != (ENode *)0x0) {
      if (pEVar1->ivex == end) {
        return pEVar1->weight;
      }
    }
    iVar2 = 0x7fffffff;
  }
  return iVar2;
}

Assistant:

int get_weight(LGraph G, int start, int end)
{
    ENode *node;

    if (start==end)
        return 0;

    node = G.vexs[start].first_edge;
    while (node!=NULL)
    {
        if (end==node->ivex)
            return node->weight;
        node = node->next_edge;
    }

    return INF;
}